

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  uint uVar1;
  Fts3DeferredToken *pFVar2;
  int *piVar3;
  Fts3Cursor *pFVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  Fts3Expr *pFVar8;
  Fts3DeferredToken **ppFVar9;
  Fts3Phrase *pFVar10;
  int iVar11;
  Fts3Expr *pFVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  size_t __n;
  Fts3Expr *p;
  ulong uVar16;
  bool bVar17;
  char *aPoslist;
  int *local_68;
  Fts3Cursor *local_60;
  Fts3Phrase *local_58;
  char *p2;
  char *p1;
  Fts3Expr *local_40;
  Fts3DeferredToken **local_38;
  
  if (*pRc != 0) {
    return 1;
  }
  switch(pExpr->eType) {
  case 1:
  case 3:
    iVar5 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if ((iVar5 != 0) && (iVar5 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc), iVar5 != 0)) {
      if (*pRc != 0) {
        return 1;
      }
      if (pExpr->eType != 1) {
        return 1;
      }
      if ((pExpr->pParent != (Fts3Expr *)0x0) && (pExpr->pParent->eType == 1)) {
        return 1;
      }
      lVar14 = 0;
      pFVar12 = pExpr;
      while (pFVar12->pLeft != (Fts3Expr *)0x0) {
        lVar14 = lVar14 + (pFVar12->pRight->pPhrase->doclist).nList;
        pFVar12 = pFVar12->pLeft;
      }
      pcVar7 = (char *)sqlite3_malloc64((lVar14 + (pFVar12->pPhrase->doclist).nList) * 2);
      if (pcVar7 == (char *)0x0) {
        *pRc = 7;
        sqlite3_free((void *)0x0);
      }
      else {
        aPoslist = (pFVar12->pPhrase->doclist).pList;
        p1 = (char *)CONCAT44(p1._4_4_,pFVar12->pPhrase->nToken);
        iVar5 = 1;
        local_60 = pCsr;
        while (((iVar5 != 0 && (pFVar12 = pFVar12->pParent, pFVar12 != (Fts3Expr *)0x0)) &&
               (pFVar12->eType == 1))) {
          iVar5 = fts3EvalNearTrim(pFVar12->nNear,pcVar7,&aPoslist,(int *)&p1,
                                   pFVar12->pRight->pPhrase);
        }
        pFVar10 = pExpr->pRight->pPhrase;
        aPoslist = (pFVar10->doclist).pList;
        p1 = (char *)CONCAT44(p1._4_4_,pFVar10->nToken);
        pFVar12 = pExpr;
        while ((pFVar12 = pFVar12->pLeft, pFVar12 != (Fts3Expr *)0x0 && (iVar5 != 0))) {
          pFVar8 = pFVar12;
          if (pFVar12->eType == 1) {
            pFVar8 = pFVar12->pRight;
          }
          iVar5 = fts3EvalNearTrim(pFVar12->pParent->nNear,pcVar7,&aPoslist,(int *)&p1,
                                   pFVar8->pPhrase);
        }
        sqlite3_free(pcVar7);
        pCsr = local_60;
        if (iVar5 != 0) {
          return 1;
        }
      }
    }
    if (pExpr->eType != 1) {
      return 0;
    }
    if ((pExpr->pParent != (Fts3Expr *)0x0) && (pExpr->pParent->eType == 1)) {
      return 0;
    }
    for (; pExpr->pPhrase == (Fts3Phrase *)0x0; pExpr = pExpr->pLeft) {
      if (pExpr->pRight->iDocid == pCsr->iPrevId) {
        fts3EvalInvalidatePoslist(pExpr->pRight->pPhrase);
      }
    }
    if (pExpr->iDocid != pCsr->iPrevId) {
      return 0;
    }
    fts3EvalInvalidatePoslist(pExpr->pPhrase);
    return 0;
  case 2:
    iVar5 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if (iVar5 == 0) {
      return 0;
    }
    iVar5 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    bVar17 = iVar5 == 0;
    goto LAB_001bc177;
  case 4:
    iVar5 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar11 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    return (uint)(iVar11 != 0 || iVar5 != 0);
  }
  if (pCsr->pDeferred == (Fts3DeferredToken *)0x0) {
LAB_001bc164:
    if (pExpr->bEof != '\0') {
      return 0;
    }
    bVar17 = pExpr->iDocid == pCsr->iPrevId;
LAB_001bc177:
    return (uint)bVar17;
  }
  local_68 = pRc;
  if (pExpr->iDocid == pCsr->iPrevId) {
    pFVar10 = pExpr->pPhrase;
    local_60 = pCsr;
    if (pExpr->bDeferred != '\0') goto LAB_001bc05c;
  }
  else {
    if (pExpr->bDeferred == '\0') goto LAB_001bc164;
    pFVar10 = pExpr->pPhrase;
LAB_001bc05c:
    local_60 = pCsr;
    fts3EvalInvalidatePoslist(pFVar10);
  }
  ppFVar9 = &pFVar10->aToken[0].pDeferred;
  uVar13 = 0xffffffffffffffff;
  __n = 0;
  pcVar7 = (char *)0x0;
  local_58 = pFVar10;
  local_40 = pExpr;
  for (uVar16 = 0; pFVar4 = local_60, uVar15 = (uint)uVar13, (long)uVar16 < (long)pFVar10->nToken;
      uVar16 = uVar16 + 1) {
    pFVar2 = *ppFVar9;
    if (pFVar2 != (Fts3DeferredToken *)0x0) {
      if (pFVar2->pList == (PendingList *)0x0) {
        sqlite3_free(pcVar7);
        (local_58->doclist).pList = (char *)0x0;
        (local_58->doclist).nList = 0;
        pFVar10 = local_58;
        goto LAB_001bc244;
      }
      local_38 = ppFVar9;
      pcVar6 = (char *)sqlite3_malloc(pFVar2->pList->nData);
      if (pcVar6 == (char *)0x0) {
        iVar5 = 7;
        goto LAB_001bc42a;
      }
      iVar5 = sqlite3Fts3GetVarint(pFVar2->pList->aData,(sqlite_int64 *)&aPoslist);
      __n = (long)pFVar2->pList->nData - (long)iVar5;
      memcpy(pcVar6,pFVar2->pList->aData + iVar5,__n);
      if (pcVar7 != (char *)0x0) {
        aPoslist = pcVar6;
        p2 = pcVar6;
        p1 = pcVar7;
        fts3PoslistPhraseMerge(&aPoslist,(int)uVar16 - uVar15,0,1,&p1,&p2);
        sqlite3_free(pcVar7);
        uVar15 = (int)aPoslist - (int)pcVar6;
        __n = (size_t)uVar15;
        if (uVar15 == 0) {
          sqlite3_free(pcVar6);
          (local_58->doclist).pList = (char *)0x0;
          (local_58->doclist).nList = 0;
          iVar5 = 0;
          goto LAB_001bc42a;
        }
      }
      uVar13 = uVar16 & 0xffffffff;
      ppFVar9 = local_38;
      pFVar10 = local_58;
      pcVar7 = pcVar6;
      pExpr = local_40;
    }
    ppFVar9 = ppFVar9 + 5;
  }
  if (-1 < (int)uVar15) {
    uVar1 = pFVar10->iDoclistToken;
    if (-1 < (int)uVar1) {
      pcVar6 = (pFVar10->doclist).pList;
      p1 = pcVar6;
      aPoslist = pcVar7;
      if (uVar1 <= uVar15) {
        p1 = pcVar7;
        aPoslist = pcVar6;
      }
      p2 = (char *)sqlite3_malloc((int)__n + 8);
      if (p2 == (char *)0x0) {
        sqlite3_free(pcVar7);
        iVar5 = 7;
        local_58 = pFVar10;
        local_40 = pExpr;
        local_60 = pFVar4;
      }
      else {
        iVar5 = uVar15 - uVar1;
        if (uVar15 < uVar1) {
          iVar5 = -(uVar15 - uVar1);
        }
        (pFVar10->doclist).pList = p2;
        iVar11 = 0;
        iVar5 = fts3PoslistPhraseMerge(&p2,iVar5,0,1,&aPoslist,&p1);
        piVar3 = local_68;
        if (iVar5 == 0) {
          sqlite3_free(p2);
          (pFVar10->doclist).pList = (char *)0x0;
        }
        else {
          (pFVar10->doclist).bFreeList = 1;
          iVar11 = (int)p2 - *(int *)&(pFVar10->doclist).pList;
        }
        (pFVar10->doclist).nList = iVar11;
        sqlite3_free(pcVar7);
        iVar5 = 0;
        local_68 = piVar3;
        local_40 = pExpr;
        local_60 = pFVar4;
      }
      goto LAB_001bc42a;
    }
    (pFVar10->doclist).pList = pcVar7;
    (pFVar10->doclist).nList = (int)__n;
    (pFVar10->doclist).iDocid = local_60->iPrevId;
    (pFVar10->doclist).bFreeList = 1;
  }
LAB_001bc244:
  iVar5 = 0;
  local_58 = pFVar10;
  local_40 = pExpr;
LAB_001bc42a:
  *local_68 = iVar5;
  pcVar7 = (local_58->doclist).pList;
  local_40->iDocid = local_60->iPrevId;
  return (uint)(pcVar7 != (char *)0x0);
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for 
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize 
        ** any instances of phrases that are part of unmatched NEAR queries. 
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0 
         && pExpr->eType==FTSQUERY_NEAR 
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred 
         && (pExpr->iDocid==pCsr->iPrevId || pExpr->bDeferred)
        ){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          assert( pExpr->bDeferred || pPhrase->doclist.bFreeList==0 );
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId);
        }
        break;
      }
    }
  }
  return bHit;
}